

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsequences.hpp
# Opt level: O3

iterator_range<burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
* __thiscall
burst::subsequences<std::initializer_list<int>const&>
          (iterator_range<burst::subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
           *__return_storage_ptr__,burst *this,initializer_list<int> *range)

{
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_> *End;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_b8;
  int *local_88;
  int *piStack_80;
  pointer local_78;
  pointer ppiStack_70;
  pointer local_68;
  difference_type dStack_60;
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_58;
  
  End = *(subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
          **)(this + 8);
  subsequence_iterator<const_int_*,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>::
  subsequence_iterator(&local_58,*(int **)this,*(int **)this + (long)End);
  local_88 = local_58.m_begin;
  piStack_80 = local_58.m_end;
  local_78 = local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppiStack_70 = local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_68 = local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  dStack_60 = local_58.m_subsequence_size;
  local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_begin = local_58.m_begin;
  local_b8.m_end = local_58.m_end;
  local_b8.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.m_subsequence_size = 0;
  boost::
  make_iterator_range<burst::subsequence_iterator<int_const*,std::vector<int_const*,std::allocator<int_const*>>>>
            (__return_storage_ptr__,(boost *)&local_88,&local_b8,End);
  if (local_b8.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.m_subsequence.
                    super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.m_subsequence.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.m_subsequence.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if (local_58.m_subsequence.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.m_subsequence.
                    super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.m_subsequence.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.m_subsequence.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto subsequences (ForwardRange && range)
    {
        auto begin = make_subsequence_iterator(std::forward<ForwardRange>(range));
        auto end = make_subsequence_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }